

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O1

void Geometry(int ip,int iq)

{
  pointer pBVar1;
  pointer pBVar2;
  int iVar3;
  ulong uVar4;
  pointer pBVar5;
  uint uVar6;
  int (*paiVar7) [512];
  int b;
  ulong uVar8;
  ulong uVar9;
  vector<Blade,_std::allocator<Blade>_> local_468;
  Clifford local_450;
  vector<Blade,_std::allocator<Blade>_> local_438;
  vector<Blade,_std::allocator<Blade>_> local_420;
  vector<Blade,_std::allocator<Blade>_> local_408;
  vector<Blade,_std::allocator<Blade>_> local_3f0;
  vector<Blade,_std::allocator<Blade>_> local_3d8;
  vector<Blade,_std::allocator<Blade>_> local_3c0;
  vector<Blade,_std::allocator<Blade>_> local_3a8;
  vector<Blade,_std::allocator<Blade>_> local_390;
  Clifford local_378;
  Clifford local_360;
  vector<Blade,_std::allocator<Blade>_> local_348;
  vector<Blade,_std::allocator<Blade>_> local_330;
  vector<Blade,_std::allocator<Blade>_> local_318;
  vector<Blade,_std::allocator<Blade>_> local_300;
  Clifford local_2e8;
  Clifford local_2d0;
  vector<Blade,_std::allocator<Blade>_> local_2b8;
  vector<Blade,_std::allocator<Blade>_> local_2a0;
  vector<Blade,_std::allocator<Blade>_> local_288;
  Clifford local_270;
  vector<Blade,_std::allocator<Blade>_> local_258;
  vector<Blade,_std::allocator<Blade>_> local_240;
  vector<Blade,_std::allocator<Blade>_> local_228;
  Clifford local_210;
  vector<Blade,_std::allocator<Blade>_> local_1f8;
  vector<Blade,_std::allocator<Blade>_> local_1e0;
  vector<Blade,_std::allocator<Blade>_> local_1c8;
  Clifford local_1b0;
  vector<Blade,_std::allocator<Blade>_> local_198;
  vector<Blade,_std::allocator<Blade>_> local_180;
  Clifford local_168;
  vector<Blade,_std::allocator<Blade>_> local_150;
  vector<Blade,_std::allocator<Blade>_> local_138;
  Clifford local_120;
  vector<Blade,_std::allocator<Blade>_> local_108;
  vector<Blade,_std::allocator<Blade>_> local_f0;
  Clifford local_d8;
  vector<Blade,_std::allocator<Blade>_> local_c0;
  vector<Blade,_std::allocator<Blade>_> local_a8;
  vector<Blade,_std::allocator<Blade>_> local_90;
  vector<Blade,_std::allocator<Blade>_> local_78;
  vector<Blade,_std::allocator<Blade>_> local_60;
  vector<Blade,_std::allocator<Blade>_> local_48;
  
  iVar3 = iq + ip;
  uVar6 = 1 << ((byte)iVar3 & 0x1f);
  uVar9 = 0xffffffffffffffff;
  if (iVar3 != 0x1f) {
    uVar9 = (long)(int)uVar6 << 2;
  }
  tp = ip;
  tq = iq;
  dim = uVar6;
  Re = (float *)operator_new__(uVar9);
  if (iVar3 != 0x1f) {
    uVar9 = 1;
    if (1 < (int)uVar6) {
      uVar9 = (ulong)uVar6;
    }
    paiVar7 = signs;
    uVar4 = 0;
    do {
      uVar8 = 0;
      do {
        iVar3 = sign2((int)uVar4,(int)uVar8);
        (*paiVar7)[uVar8] = iVar3;
        uVar8 = uVar8 + 1;
      } while (uVar9 != uVar8);
      uVar4 = uVar4 + 1;
      paiVar7 = paiVar7 + 1;
    } while (uVar4 != uVar9);
  }
  pBVar2 = e0.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pBVar1 = e0.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pBVar5 = e0.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (e0.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish
      != e0.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
         _M_start) {
    do {
      Blade::~Blade(pBVar5);
      pBVar5 = pBVar5 + 1;
    } while (pBVar5 != pBVar2);
    e0.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
         pBVar1;
  }
  pBVar2 = e1.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pBVar1 = e1.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pBVar5 = e1.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (e1.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish
      != e1.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
         _M_start) {
    do {
      Blade::~Blade(pBVar5);
      pBVar5 = pBVar5 + 1;
    } while (pBVar5 != pBVar2);
    e1.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
         pBVar1;
  }
  pBVar2 = e2.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pBVar1 = e2.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pBVar5 = e2.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (e2.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish
      != e2.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
         _M_start) {
    do {
      Blade::~Blade(pBVar5);
      pBVar5 = pBVar5 + 1;
    } while (pBVar5 != pBVar2);
    e2.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
         pBVar1;
  }
  pBVar2 = e3.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pBVar1 = e3.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pBVar5 = e3.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (e3.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish
      != e3.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
         _M_start) {
    do {
      Blade::~Blade(pBVar5);
      pBVar5 = pBVar5 + 1;
    } while (pBVar5 != pBVar2);
    e3.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
         pBVar1;
  }
  pBVar2 = e4.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pBVar1 = e4.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pBVar5 = e4.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (e4.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish
      != e4.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
         _M_start) {
    do {
      Blade::~Blade(pBVar5);
      pBVar5 = pBVar5 + 1;
    } while (pBVar5 != pBVar2);
    e4.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
         pBVar1;
  }
  pBVar2 = e5.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pBVar1 = e5.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pBVar5 = e5.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (e5.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish
      != e5.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
         _M_start) {
    do {
      Blade::~Blade(pBVar5);
      pBVar5 = pBVar5 + 1;
    } while (pBVar5 != pBVar2);
    e5.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
         pBVar1;
  }
  pBVar2 = e6.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pBVar1 = e6.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pBVar5 = e6.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (e6.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish
      != e6.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
         _M_start) {
    do {
      Blade::~Blade(pBVar5);
      pBVar5 = pBVar5 + 1;
    } while (pBVar5 != pBVar2);
    e6.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
         pBVar1;
  }
  pBVar2 = e7.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pBVar1 = e7.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pBVar5 = e7.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (e7.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish
      != e7.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
         _M_start) {
    do {
      Blade::~Blade(pBVar5);
      pBVar5 = pBVar5 + 1;
    } while (pBVar5 != pBVar2);
    e7.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
         pBVar1;
  }
  pBVar2 = e8.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pBVar1 = e8.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pBVar5 = e8.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (e8.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish
      != e8.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
         _M_start) {
    do {
      Blade::~Blade(pBVar5);
      pBVar5 = pBVar5 + 1;
    } while (pBVar5 != pBVar2);
    e8.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
         pBVar1;
  }
  pBVar2 = e9.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pBVar1 = e9.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pBVar5 = e9.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (e9.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish
      != e9.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
         _M_start) {
    do {
      Blade::~Blade(pBVar5);
      pBVar5 = pBVar5 + 1;
    } while (pBVar5 != pBVar2);
    e9.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
         pBVar1;
  }
  pBVar2 = Ie.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pBVar1 = Ie.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pBVar5 = Ie.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (Ie.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish
      != Ie.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
         _M_start) {
    do {
      Blade::~Blade(pBVar5);
      pBVar5 = pBVar5 + 1;
    } while (pBVar5 != pBVar2);
    Ie.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
         pBVar1;
  }
  pBVar2 = Esd.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pBVar1 = Esd.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pBVar5 = Esd.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (Esd.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      Esd.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_start
     ) {
    do {
      Blade::~Blade(pBVar5);
      pBVar5 = pBVar5 + 1;
    } while (pBVar5 != pBVar2);
    Esd.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish
         = pBVar1;
  }
  pBVar2 = Eds.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pBVar1 = Eds.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pBVar5 = Eds.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (Eds.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      Eds.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_start
     ) {
    do {
      Blade::~Blade(pBVar5);
      pBVar5 = pBVar5 + 1;
    } while (pBVar5 != pBVar2);
    Eds.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish
         = pBVar1;
  }
  pBVar2 = eox.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pBVar1 = eox.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pBVar5 = eox.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (eox.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      eox.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_start
     ) {
    do {
      Blade::~Blade(pBVar5);
      pBVar5 = pBVar5 + 1;
    } while (pBVar5 != pBVar2);
    eox.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish
         = pBVar1;
  }
  pBVar2 = eoy.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pBVar1 = eoy.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pBVar5 = eoy.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (eoy.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      eoy.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_start
     ) {
    do {
      Blade::~Blade(pBVar5);
      pBVar5 = pBVar5 + 1;
    } while (pBVar5 != pBVar2);
    eoy.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish
         = pBVar1;
  }
  pBVar2 = eoz.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pBVar1 = eoz.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pBVar5 = eoz.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (eoz.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      eoz.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_start
     ) {
    do {
      Blade::~Blade(pBVar5);
      pBVar5 = pBVar5 + 1;
    } while (pBVar5 != pBVar2);
    eoz.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish
         = pBVar1;
  }
  pBVar2 = ex.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pBVar1 = ex.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pBVar5 = ex.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (ex.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish
      != ex.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
         _M_start) {
    do {
      Blade::~Blade(pBVar5);
      pBVar5 = pBVar5 + 1;
    } while (pBVar5 != pBVar2);
    ex.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
         pBVar1;
  }
  pBVar2 = ey.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pBVar1 = ey.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pBVar5 = ey.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (ey.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish
      != ey.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
         _M_start) {
    do {
      Blade::~Blade(pBVar5);
      pBVar5 = pBVar5 + 1;
    } while (pBVar5 != pBVar2);
    ey.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
         pBVar1;
  }
  pBVar2 = ez.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pBVar1 = ez.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pBVar5 = ez.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (ez.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish
      != ez.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
         _M_start) {
    do {
      Blade::~Blade(pBVar5);
      pBVar5 = pBVar5 + 1;
    } while (pBVar5 != pBVar2);
    ez.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
         pBVar1;
  }
  pBVar2 = e.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pBVar1 = e.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pBVar5 = e.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (e.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish
      != e.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
         _M_start) {
    do {
      Blade::~Blade(pBVar5);
      pBVar5 = pBVar5 + 1;
    } while (pBVar5 != pBVar2);
    e.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
         pBVar1;
  }
  pBVar2 = eo.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pBVar1 = eo.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pBVar5 = eo.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (eo.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish
      != eo.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
         _M_start) {
    do {
      Blade::~Blade(pBVar5);
      pBVar5 = pBVar5 + 1;
    } while (pBVar5 != pBVar2);
    eo.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
         pBVar1;
  }
  pBVar1 = e0.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Blade::Blade((Blade *)&local_468,0);
  std::vector<Blade,_std::allocator<Blade>_>::_M_insert_rval
            (&e0,(const_iterator)pBVar1,(value_type *)&local_468);
  Blade::~Blade((Blade *)&local_468);
  pBVar1 = e1.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Blade::Blade((Blade *)&local_468,1);
  std::vector<Blade,_std::allocator<Blade>_>::_M_insert_rval
            (&e1,(const_iterator)pBVar1,(value_type *)&local_468);
  Blade::~Blade((Blade *)&local_468);
  pBVar1 = e2.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Blade::Blade((Blade *)&local_468,2);
  std::vector<Blade,_std::allocator<Blade>_>::_M_insert_rval
            (&e2,(const_iterator)pBVar1,(value_type *)&local_468);
  Blade::~Blade((Blade *)&local_468);
  pBVar1 = e3.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Blade::Blade((Blade *)&local_468,4);
  std::vector<Blade,_std::allocator<Blade>_>::_M_insert_rval
            (&e3,(const_iterator)pBVar1,(value_type *)&local_468);
  Blade::~Blade((Blade *)&local_468);
  pBVar1 = e4.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Blade::Blade((Blade *)&local_468,8);
  std::vector<Blade,_std::allocator<Blade>_>::_M_insert_rval
            (&e4,(const_iterator)pBVar1,(value_type *)&local_468);
  Blade::~Blade((Blade *)&local_468);
  pBVar1 = e5.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Blade::Blade((Blade *)&local_468,0x10);
  std::vector<Blade,_std::allocator<Blade>_>::_M_insert_rval
            (&e5,(const_iterator)pBVar1,(value_type *)&local_468);
  Blade::~Blade((Blade *)&local_468);
  pBVar1 = e6.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Blade::Blade((Blade *)&local_468,0x20);
  std::vector<Blade,_std::allocator<Blade>_>::_M_insert_rval
            (&e6,(const_iterator)pBVar1,(value_type *)&local_468);
  Blade::~Blade((Blade *)&local_468);
  pBVar1 = e7.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Blade::Blade((Blade *)&local_468,0x40);
  std::vector<Blade,_std::allocator<Blade>_>::_M_insert_rval
            (&e7,(const_iterator)pBVar1,(value_type *)&local_468);
  Blade::~Blade((Blade *)&local_468);
  pBVar1 = e8.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Blade::Blade((Blade *)&local_468,0x80);
  std::vector<Blade,_std::allocator<Blade>_>::_M_insert_rval
            (&e8,(const_iterator)pBVar1,(value_type *)&local_468);
  Blade::~Blade((Blade *)&local_468);
  pBVar1 = e9.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Blade::Blade((Blade *)&local_468,0x100);
  std::vector<Blade,_std::allocator<Blade>_>::_M_insert_rval
            (&e9,(const_iterator)pBVar1,(value_type *)&local_468);
  Blade::~Blade((Blade *)&local_468);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_48,&e7);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_60,&e4);
  operator+(&local_450,&local_48,&local_60);
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       ex.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = ex.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
              _M_finish;
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = ex.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
             _M_start;
  ex.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_start =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_start;
  ex.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  ex.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_468);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_60);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_48);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_78,&e8);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_90,&e5);
  operator+(&local_450,&local_78,&local_90);
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       ey.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = ey.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
              _M_finish;
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = ey.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
             _M_start;
  ey.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_start =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_start;
  ey.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  ey.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_468);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_90);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_78);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_a8,&e9);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_c0,&e6);
  operator+(&local_450,&local_a8,&local_c0);
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       ez.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = ez.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
              _M_finish;
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = ez.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
             _M_start;
  ez.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_start =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_start;
  ez.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  ez.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_468);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_c0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_a8);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_f0,&e7);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_108,&e4);
  operator-(&local_d8,&local_f0,&local_108);
  operator*(&local_450,0.5,&local_d8);
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       eox.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = eox.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
              _M_finish;
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = eox.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
             _M_start;
  eox.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_start =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_start;
  eox.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  eox.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_468);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_d8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_108);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_f0);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_138,&e8);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_150,&e5);
  operator-(&local_120,&local_138,&local_150);
  operator*(&local_450,0.5,&local_120);
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       eoy.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = eoy.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
              _M_finish;
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = eoy.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
             _M_start;
  eoy.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_start =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_start;
  eoy.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  eoy.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_468);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_120);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_150);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_138);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_180,&e9);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_198,&e6);
  operator-(&local_168,&local_180,&local_198);
  operator*(&local_450,0.5,&local_168);
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       eoz.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = eoz.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
              _M_finish;
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = eoz.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
             _M_start;
  eoz.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_start =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_start;
  eoz.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  eoz.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_468);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_168);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_198);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_180);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_1c8,&ex);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_1e0,&ey);
  operator+(&local_1b0,&local_1c8,&local_1e0);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_1f8,&ez);
  operator+(&local_450,&local_1b0,&local_1f8);
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       e.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = e.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
              _M_finish;
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = e.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
             _M_start;
  e.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_start =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_start;
  e.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  e.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_468);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_1f8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_1b0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_1e0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_1c8);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_228,&eox);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_240,&eoy);
  operator+(&local_210,&local_228,&local_240);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_258,&eoz);
  operator+(&local_450,&local_210,&local_258);
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       eo.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = eo.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
              _M_finish;
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = eo.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
             _M_start;
  eo.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_start =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_start;
  eo.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  eo.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_468);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_258);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_210);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_240);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_228);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_288,&e1);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_2a0,&e2);
  operator^(&local_270,&local_288,&local_2a0);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_2b8,&e3);
  operator^(&local_450,&local_270,&local_2b8);
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       Ie.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = Ie.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
              _M_finish;
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = Ie.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
             _M_start;
  Ie.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_start =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_start;
  Ie.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  Ie.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_468);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_2b8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_270);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_2a0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_288);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_300,&ex);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_318,&ey);
  operator^(&local_2e8,&local_300,&local_318);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_330,&ez);
  operator^(&local_2d0,&local_2e8,&local_330);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_348,&eo);
  operator^(&local_450,&local_2d0,&local_348);
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       Esd.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = Esd.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
              _M_finish;
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = Esd.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
             _M_start;
  Esd.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_start =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_start;
  Esd.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  Esd.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_468);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_348);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_2d0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_330);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_2e8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_318);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_300);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_390,&eox);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_3a8,&eoy);
  operator^(&local_378,&local_390,&local_3a8);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_3c0,&eoz);
  operator^(&local_360,&local_378,&local_3c0);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_3d8,&e);
  operator^(&local_450,&local_360,&local_3d8);
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       Eds.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = Eds.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
              _M_finish;
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = Eds.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
             _M_start;
  Eds.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_start =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_start;
  Eds.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  Eds.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_468);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_3d8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_360);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_3c0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_378);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_3a8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_390);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_3f0,&Ie);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_408,&Esd);
  operator^(&local_450,&local_3f0,&local_408);
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       Isd.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = Isd.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
              _M_finish;
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = Isd.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
             _M_start;
  Isd.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_start =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_start;
  Isd.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  Isd.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_468);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_408);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_3f0);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_420,&Ie);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_438,&Eds);
  operator^(&local_450,&local_420,&local_438);
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       Ids.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = Ids.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
              _M_finish;
  local_468.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = Ids.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
             _M_start;
  Ids.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_start =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_start;
  Ids.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  Ids.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_450.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_468);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_438);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_420);
  return;
}

Assistant:

void Geometry(int ip,int iq)
{
//dimencion of algebra
	tp=ip; tq=iq;
	
	dim=(1<<(tp+tq));
	Re=new float[dim];

	for(int a=0;a<dim;a++)
	{
		for(int b=0;b<dim;b++)
		{
			signs[a][b]=sign2(a,b);	
		}
		
	}

	//init basis
	e0.clear();
	e1.clear();
	e2.clear();
	e3.clear();
	e4.clear();
	e5.clear();
	e6.clear();
	e7.clear();
	e8.clear();
	e9.clear();

	Ie.clear();
	Esd.clear();
	Eds.clear();

	eox.clear();
	eoy.clear();
	eoz.clear();
	ex.clear();
	ey.clear();
	ez.clear();
	e.clear();
	eo.clear();

	e0.insert(e0.begin(),Blade(0));
	e1.insert(e1.begin(),Blade(1));
	e2.insert(e2.begin(),Blade(2));
	e3.insert(e3.begin(),Blade(4));
	e4.insert(e4.begin(),Blade(8));
	e5.insert(e5.begin(),Blade(16));
	e6.insert(e6.begin(),Blade(32));
	e7.insert(e7.begin(),Blade(64));
	e8.insert(e8.begin(),Blade(128));
	e9.insert(e9.begin(),Blade(256));

	
	ex=e7+e4;
    ey=e8+e5;
    ez=e9+e6;
	
    eox=0.5*(e7-e4);
    eoy=0.5*(e8-e5);
    eoz=0.5*(e9-e6);
	
    e=ex+ey+ez;
    eo=eox+eoy+eoz;
  
    Ie=e1^e2^e3;
    Esd=ex^ey^ez^eo;
    Eds=eox^eoy^eoz^e;
    Isd=Ie^Esd;
    Ids=Ie^Eds;

  return ;
	
}